

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkatom.c
# Opt level: O1

LispPTR make_atom(char *char_base,DLword offset,DLword length)

{
  byte bVar1;
  ushort uVar2;
  ulong uVar3;
  undefined2 in_register_00000012;
  uint uVar4;
  uint uVar5;
  undefined6 in_register_00000032;
  long lVar6;
  LispPTR LVar7;
  uint uVar8;
  ulong uVar9;
  
  uVar3 = CONCAT62(in_register_00000032,offset) & 0xffffffff;
  if (CONCAT22(in_register_00000012,length) == 0) {
    uVar4 = 0xff;
    uVar5 = 0;
  }
  else {
    bVar1 = char_base[uVar3];
    uVar4 = (uint)bVar1;
    if (CONCAT22(in_register_00000012,length) == 1) {
      if (bVar1 < 0x3a) {
        if (bVar1 < 0x30) {
          LVar7 = uVar4 + 2;
        }
        else {
          LVar7 = uVar4 + 0xdffd0;
        }
      }
      else {
        LVar7 = uVar4 - 8;
      }
      return LVar7;
    }
    uVar5 = uVar4 << 8;
    if (1 < length) {
      lVar6 = 1;
      do {
        uVar5 = (int)char_base[lVar6 + uVar3] + (uVar5 + (uVar5 & 0xfff) * 4) * 0x101;
        lVar6 = lVar6 + 1;
      } while (length != (DLword)lVar6);
    }
  }
  uVar2 = *(ushort *)((ulong)(AtomHT + (uVar5 & 0xffff)) ^ 2);
  if (uVar2 != 0) {
    uVar4 = uVar4 ^ uVar5;
    do {
      uVar8 = uVar2 - 1 & 0xffff;
      uVar9 = (ulong)(*(uint *)((long)AtomSpace + (ulong)(uVar8 * 0x14)) & 0xfffffff);
      if (*(byte *)((ulong)(Lisp_world + uVar9) ^ 3) == length) {
        if (length == 0) {
          return uVar8;
        }
        lVar6 = 0;
        while (*(char *)((long)Lisp_world + lVar6 + uVar9 * 2 + 1 ^ 3) == char_base[lVar6 + uVar3])
        {
          lVar6 = lVar6 + 1;
          if ((uint)length == (uint)lVar6) {
            return uVar8;
          }
        }
      }
      uVar5 = uVar5 + (uVar4 & 0x3e) + 1;
      uVar2 = *(ushort *)((ulong)(AtomHT + (uVar5 & 0xffff)) ^ 2);
    } while (uVar2 != 0);
  }
  return 0xffffffff;
}

Assistant:

LispPTR make_atom(const char *char_base, DLword offset, DLword length)
{
  DLword hash;
  LispPTR hash_entry; /* hash entry contents */
  DLword atom_index;
  DLword reprobe;

  PNCell *pnptr;
  char *pname_base;
  unsigned short first_char;

#ifdef TRACE2
  printf("TRACE: make_atom( %s , offset= %d, len= %d)\n", char_base, offset, length);
#endif

  first_char = (*(char_base + offset)) & 0xff;
  switch (length) {
  case 0:
    /* the zero-length atom has hashcode 0 */
    hash = 0;
    first_char = 255;
    break;

  case 1:
    /* One-character atoms live in well known places, no need to hash */
    if (first_char > '9')
      return ((LispPTR)(ATOMoffset + (first_char - 10)));
    if (first_char >= '0' ) /* 0..9 */
      return ((LispPTR)(S_POSITIVE + (first_char - '0')));
    /* other one character atoms */
    return ((LispPTR)(ATOMoffset + first_char));

  default:
    hash = compute_hash(char_base, offset, length);
    break;
  }

  /* This point corresponds with LP in Lisp source */

  /* following for loop does not exit until it finds new hash entry or same atom */
  for (reprobe = Atom_reprobe(hash, first_char); (hash_entry = GETWORD(AtomHT + hash)) != 0;
       hash = ((hash + reprobe) & 0xffff)) {
    atom_index = (DLword)(hash_entry - 1);
    /* get pname pointer */
    pnptr = (PNCell *)GetPnameCell(atom_index);
    pname_base = (char *)NativeAligned2FromLAddr(POINTERMASK & pnptr->pnamebase);

    if ((length == GETBYTE(pname_base)) &&
        (compare_chars(++pname_base, char_base + offset, length) == T)) {
      DBPRINT(("FOUND the atom. \n"));
      return (atom_index); /* found existing atom */
    }
    DBPRINT(("HASH doesn't hit. reprobe!\n"));

  } /* for end */

  /* we can't find that atom, then we should make new atom */
  DBPRINT(("HASH NEVER HIT.  Returning -1.\n"));
  return (0xffffffff);
  /** Don't create newatom now **/
}